

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const,std::__cxx11::string_const>
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
            basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  size_t sVar1;
  size_t sVar2;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  undefined1 local_f9;
  char *local_f8;
  size_t local_f0;
  undefined1 local_e3;
  undefined1 local_e2;
  undefined1 local_e1;
  char *local_d8 [3];
  undefined1 *local_c0;
  basic_string_view<char> local_b8;
  char **local_a8;
  basic_string_view<char> local_a0;
  undefined1 local_89;
  char *local_88;
  size_t local_80;
  undefined1 local_73;
  undefined1 local_72;
  undefined1 local_71;
  char *local_68 [4];
  undefined1 *local_48;
  basic_string_view<char> local_40;
  char **local_30;
  basic_string_view<char> local_28 [2];
  
  local_71 = 1;
  local_72 = 1;
  local_73 = 1;
  local_48 = &local_89;
  local_40 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x27c80e);
  local_88 = local_40.data_;
  local_80 = local_40.size_;
  local_28[0].data_ = local_40.data_;
  local_28[0].size_ = local_40.size_;
  local_30 = local_68;
  local_68[0] = basic_string_view<char>::data(local_28);
  sVar1 = basic_string_view<char>::size(local_28);
  local_e1 = 1;
  local_e2 = 1;
  local_e3 = 1;
  local_c0 = &local_f9;
  local_b8 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x27c915);
  local_f8 = local_b8.data_;
  local_f0 = local_b8.size_;
  local_a0.data_ = local_b8.data_;
  local_a0.size_ = local_b8.size_;
  local_a8 = local_d8;
  local_d8[0] = basic_string_view<char>::data(&local_a0);
  sVar2 = basic_string_view<char>::size(&local_a0);
  (in_RDI->data_).args_[0].field_0.string.data = local_68[0];
  (in_RDI->data_).args_[0].field_0.string.size = sVar1;
  (in_RDI->data_).args_[1].field_0.string.data = local_d8[0];
  (in_RDI->data_).args_[1].field_0.string.size = sVar2;
  return in_RDI;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}